

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_qa.cpp
# Opt level: O0

Id dxil_spv::build_ssbo_load_array
             (Builder *builder,Id value_type,Id ssbo_id,uint32_t member,Id offset)

{
  Id IVar1;
  pointer pIVar2;
  pointer this;
  Block *pBVar3;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_58;
  Id local_4c;
  undefined4 local_48;
  Id result_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  __single_object load;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  __single_object chain;
  Id ptr_id;
  Id offset_local;
  uint32_t member_local;
  Id ssbo_id_local;
  Id value_type_local;
  Builder *builder_local;
  
  member_local = value_type;
  _ssbo_id_local = builder;
  chain._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
       spv::Builder::makePointer(builder,StorageClassStorageBuffer,value_type);
  load._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
       spv::Builder::getUniqueId(_ssbo_id_local);
  load._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x41;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_30,
             (uint *)((long)&load._M_t.
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
             (Op *)((long)&chain._M_t.
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4));
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_30);
  spv::Instruction::addIdOperand(pIVar2,ssbo_id);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_30);
  IVar1 = spv::Builder::makeUintConstant(_ssbo_id_local,member,false);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_30);
  spv::Instruction::addIdOperand(pIVar2,offset);
  result_id = spv::Builder::getUniqueId(_ssbo_id_local);
  local_48 = 0x3d;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_40,&result_id,&member_local);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_40);
  this = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                   (&local_30);
  IVar1 = spv::Instruction::getResultId(this);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_40);
  local_4c = spv::Instruction::getResultId(pIVar2);
  pBVar3 = spv::Builder::getBuildPoint(_ssbo_id_local);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_58,&local_30);
  spv::Block::addInstruction(pBVar3,&local_58);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_58);
  pBVar3 = spv::Builder::getBuildPoint(_ssbo_id_local);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_60,&local_40);
  spv::Block::addInstruction(pBVar3,&local_60);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_60);
  IVar1 = local_4c;
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_30);
  return IVar1;
}

Assistant:

static spv::Id build_ssbo_load_array(spv::Builder &builder, spv::Id value_type, spv::Id ssbo_id, uint32_t member,
                                     spv::Id offset)
{
	spv::Id ptr_id = builder.makePointer(spv::StorageClassStorageBuffer, value_type);
	auto chain = std::make_unique<spv::Instruction>(builder.getUniqueId(), ptr_id, spv::OpAccessChain);
	chain->addIdOperand(ssbo_id);
	chain->addIdOperand(builder.makeUintConstant(member));
	chain->addIdOperand(offset);

	auto load = std::make_unique<spv::Instruction>(builder.getUniqueId(), value_type, spv::OpLoad);
	load->addIdOperand(chain->getResultId());
	spv::Id result_id = load->getResultId();

	builder.getBuildPoint()->addInstruction(std::move(chain));
	builder.getBuildPoint()->addInstruction(std::move(load));
	return result_id;
}